

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O2

void parse_gd3(byte_ *in,byte_ *end,track_info_t *out)

{
  byte_ *pbVar1;
  
  pbVar1 = get_gd3_pair(in,end,out->song);
  pbVar1 = get_gd3_pair(pbVar1,end,out->game);
  pbVar1 = get_gd3_pair(pbVar1,end,out->system);
  pbVar1 = get_gd3_pair(pbVar1,end,out->author);
  pbVar1 = get_gd3_str(pbVar1,end,out->copyright);
  pbVar1 = get_gd3_pair(pbVar1,end,out->dumper);
  get_gd3_str(pbVar1,end,out->comment);
  return;
}

Assistant:

static void parse_gd3( byte const* in, byte const* end, track_info_t* out )
{
	in = get_gd3_pair( in, end, out->song );
	in = get_gd3_pair( in, end, out->game );
	in = get_gd3_pair( in, end, out->system );
	in = get_gd3_pair( in, end, out->author );
	in = get_gd3_str ( in, end, out->copyright );
	in = get_gd3_pair( in, end, out->dumper );
	in = get_gd3_str ( in, end, out->comment );
}